

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O3

void __thiscall Memory::RecyclerSweepManager::FinishSweep(RecyclerSweepManager *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *pRVar4;
  size_t sVar5;
  byte bVar6;
  undefined8 *in_FS_OFFSET;
  
  bVar6 = this->partial;
  pRVar4 = this->recycler;
  if ((bool)bVar6 != pRVar4->inPartialCollectMode) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x8e,"(this->partial == recycler->inPartialCollectMode)",
                       "this->partial == recycler->inPartialCollectMode");
    if (!bVar3) goto LAB_0028aa8b;
    *puVar1 = 0;
    pRVar4 = this->recycler;
    bVar6 = pRVar4->inPartialCollectMode;
  }
  if ((bVar6 & 1) == 0) {
    if (this->adjustPartialHeuristics == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0xd1,"(!this->adjustPartialHeuristics)","!this->adjustPartialHeuristics");
      if (!bVar3) goto LAB_0028aa8b;
      *puVar1 = 0;
      pRVar4 = this->recycler;
    }
    if (pRVar4->partialUncollectedAllocBytes != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0xd4,"(recycler->partialUncollectedAllocBytes == 0)",
                         "recycler->partialUncollectedAllocBytes == 0");
      if (!bVar3) {
LAB_0028aa8b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
  }
  else {
    bVar3 = AdjustPartialHeuristics(this);
    if (bVar3) {
      if (this->inPartialCollect == false) {
        sVar5 = 0;
      }
      else {
        sVar5 = this->nextPartialUncollectedAllocBytes;
      }
      pRVar4 = this->recycler;
      pRVar4->partialUncollectedAllocBytes = sVar5;
      bVar3 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,PartialCollectPhase);
      if (bVar3) {
        Output::Print(L"AdjustPartialHeuristics returned true\n");
        Output::Print(L"  partialUncollectedAllocBytes = %d\n",
                      this->recycler->partialUncollectedAllocBytes);
        Output::Print(L"  nextPartialUncollectedAllocBytes = %d\n",
                      this->nextPartialUncollectedAllocBytes);
      }
      HeapInfoManager::SweepPartialReusePages(&this->recycler->autoHeap,this);
    }
    else {
      bVar3 = Js::Phases::IsEnabled(&this->recycler->recyclerFlagsTable->Trace,PartialCollectPhase);
      if (bVar3) {
        Output::Print(L"AdjustPartialHeuristics returned false\n");
      }
      if (this->background == true) {
        Recycler::BackgroundFinishPartialCollect(this->recycler,this);
      }
      else {
        Recycler::FinishPartialCollect(this->recycler,this);
      }
    }
  }
  Recycler::SweepPendingObjects(this->recycler,this);
  return;
}

Assistant:

void
RecyclerSweepManager::FinishSweep()
{
#if ENABLE_PARTIAL_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (recycler->collectionState == CollectionStateConcurrentSweepPass2)
    {
        GCETW_INTERNAL(GC_START, (recycler, ETWEvent_ConcurrentSweep_Pass2));
        GCETW_INTERNAL(GC_START2, (recycler, ETWEvent_ConcurrentSweep_Pass2, recycler->collectionStartReason, recycler->collectionStartFlags));
    }
#endif

    Assert(this->partial == recycler->inPartialCollectMode);
    // Adjust heuristics
    if (recycler->inPartialCollectMode)
    {
        if (this->AdjustPartialHeuristics())
        {
            GCETW(GC_SWEEP_PARTIAL_REUSE_PAGE_START, (recycler));

            // If we are doing a full concurrent GC, all allocated bytes are consider "collected".
            // We only start accumulating uncollected allocate bytes during partial GC.
            // FinishPartialCollect will reset it to 0 if we are not doing a partial GC
            recycler->partialUncollectedAllocBytes = this->InPartialCollect() ? this->nextPartialUncollectedAllocBytes : 0;

#ifdef RECYCLER_TRACE
            if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::PartialCollectPhase))
            {
                Output::Print(_u("AdjustPartialHeuristics returned true\n"));
                Output::Print(_u("  partialUncollectedAllocBytes = %d\n"), recycler->partialUncollectedAllocBytes);
                Output::Print(_u("  nextPartialUncollectedAllocBytes = %d\n"), this->nextPartialUncollectedAllocBytes);
            }
#endif

            recycler->autoHeap.SweepPartialReusePages(*this);

            GCETW(GC_SWEEP_PARTIAL_REUSE_PAGE_STOP, (recycler));

#ifdef RECYCLER_WRITE_WATCH
            if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
            {
                if (!this->IsBackground())
                {
                    RECYCLER_PROFILE_EXEC_BEGIN(recycler, Js::ResetWriteWatchPhase);
                    if (!recycler->autoHeap.ResetWriteWatch())
                    {
                        // Shouldn't happen
                        Assert(false);
                        recycler->enablePartialCollect = false;
                        recycler->FinishPartialCollect(this);
                    }
                    RECYCLER_PROFILE_EXEC_END(recycler, Js::ResetWriteWatchPhase);
                }
            }
#endif
        }
        else
        {
#ifdef RECYCLER_TRACE
            if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::PartialCollectPhase))
            {
                Output::Print(_u("AdjustPartialHeuristics returned false\n"));
            }
#endif

#if ENABLE_CONCURRENT_GC
            if (this->IsBackground())
            {
                recycler->BackgroundFinishPartialCollect(this);
            }
            else
#endif
            {
                recycler->FinishPartialCollect(this);
            }
        }
    }
    else
    {
        Assert(!this->adjustPartialHeuristics);

        // Initial value or Sweep should have called FinishPartialCollect to these if we are not doing partial
        Assert(recycler->partialUncollectedAllocBytes == 0);
    }

#if ENABLE_CONCURRENT_GC
    recycler->SweepPendingObjects(*this);
#endif
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (recycler->collectionState == CollectionStateConcurrentSweepPass2)
    {
        GCETW_INTERNAL(GC_STOP, (recycler, ETWEvent_ConcurrentSweep_Pass2));
        GCETW_INTERNAL(GC_STOP2, (recycler, ETWEvent_ConcurrentSweep_Pass2, recycler->collectionStartReason, recycler->collectionStartFlags));
    }
#endif
#endif
}